

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::crossMesh(Mesh *__return_storage_ptr__,vec3 *_pos,float _width)

{
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_58 [2];
  vec3 linePoints [4];
  float _width_local;
  vec3 *_pos_local;
  Mesh *mesh;
  
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)local_58,(_pos->field_0).x,(_pos->field_1).y,
             (_pos->field_2).z);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&linePoints[0].field_1,(_pos->field_0).x,
             (_pos->field_1).y,(_pos->field_2).z);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&linePoints[1].field_1,(_pos->field_0).x,
             (_pos->field_1).y,(_pos->field_2).z);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&linePoints[2].field_1,(_pos->field_0).x,
             (_pos->field_1).y,(_pos->field_2).z);
  local_58[0].x = local_58[0].x - _width;
  linePoints[0].field_1.y = linePoints[0].field_1.y + _width;
  linePoints[1].field_2.z = linePoints[1].field_2.z - _width;
  linePoints[2].field_2.z = linePoints[2].field_2.z + _width;
  Mesh::Mesh(__return_storage_ptr__);
  Mesh::setDrawMode(__return_storage_ptr__,LINES);
  Mesh::addVertices(__return_storage_ptr__,(vec3 *)local_58,4);
  return __return_storage_ptr__;
}

Assistant:

Mesh crossMesh(const glm::vec3 &_pos, float _width) {
    glm::vec3 linePoints[4] = { glm::vec3(_pos.x,_pos.y,_pos.z),
                                glm::vec3(_pos.x,_pos.y,_pos.z),
                                glm::vec3(_pos.x,_pos.y,_pos.z),
                                glm::vec3(_pos.x,_pos.y,_pos.z) };

    linePoints[0].x -= _width;
    linePoints[1].x += _width;
    linePoints[2].y -= _width;
    linePoints[3].y += _width;

    Mesh mesh;
    mesh.setDrawMode(LINES);
    mesh.addVertices(linePoints, 4);

    // mesh.append( line(linePoints[0] , linePoints[1]) );
    // mesh.append( line(linePoints[2] , linePoints[3]) );

    return mesh;
}